

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_3::InputFile::initialize(InputFile *this)

{
  exr_storage_t eVar1;
  element_type *peVar2;
  InputPartData *part;
  ostream *poVar3;
  char *pcVar4;
  stringstream *text;
  stringstream _iex_throw_s;
  int partidx;
  pointer in_stack_fffffffffffffdb8;
  unique_ptr<Imf_3_3::CompositeDeepScanLine,_std::default_delete<Imf_3_3::CompositeDeepScanLine>_>
  *in_stack_fffffffffffffdc0;
  DeepScanLineInputFile *in_stack_fffffffffffffdc8;
  CompositeDeepScanLine *in_stack_fffffffffffffdd0;
  InputPartData *in_stack_fffffffffffffde8;
  DeepScanLineInputFile *in_stack_fffffffffffffdf0;
  InputPartData *this_00;
  stringstream local_1b0 [16];
  ostream local_1a0 [300];
  int in_stack_ffffffffffffff8c;
  Context *in_stack_ffffffffffffff90;
  
  peVar2 = std::
           __shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1a3648);
  Data::getPartIdx(peVar2);
  eVar1 = Context::storage(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  peVar2 = std::
           __shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1a3683);
  peVar2->_storage = eVar1;
  peVar2 = std::
           __shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1a369e);
  if (peVar2->_storage == EXR_STORAGE_DEEP_SCANLINE) {
    std::__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1a36be);
    operator_new(0x20);
    std::__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1a36e8);
    DeepScanLineInputFile::DeepScanLineInputFile
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    std::
    unique_ptr<Imf_3_3::DeepScanLineInputFile,_std::default_delete<Imf_3_3::DeepScanLineInputFile>_>
    ::reset((unique_ptr<Imf_3_3::DeepScanLineInputFile,_std::default_delete<Imf_3_3::DeepScanLineInputFile>_>
             *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    std::make_unique<Imf_3_3::CompositeDeepScanLine>();
    std::__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1a3728);
    std::
    unique_ptr<Imf_3_3::CompositeDeepScanLine,_std::default_delete<Imf_3_3::CompositeDeepScanLine>_>
    ::operator=(in_stack_fffffffffffffdc0,
                (unique_ptr<Imf_3_3::CompositeDeepScanLine,_std::default_delete<Imf_3_3::CompositeDeepScanLine>_>
                 *)in_stack_fffffffffffffdb8);
    std::
    unique_ptr<Imf_3_3::CompositeDeepScanLine,_std::default_delete<Imf_3_3::CompositeDeepScanLine>_>
    ::~unique_ptr(in_stack_fffffffffffffdc0);
    std::__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1a375a);
    std::
    unique_ptr<Imf_3_3::CompositeDeepScanLine,_std::default_delete<Imf_3_3::CompositeDeepScanLine>_>
    ::operator->((unique_ptr<Imf_3_3::CompositeDeepScanLine,_std::default_delete<Imf_3_3::CompositeDeepScanLine>_>
                  *)0x1a3766);
    std::__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1a377c);
    std::
    unique_ptr<Imf_3_3::DeepScanLineInputFile,_std::default_delete<Imf_3_3::DeepScanLineInputFile>_>
    ::get((unique_ptr<Imf_3_3::DeepScanLineInputFile,_std::default_delete<Imf_3_3::DeepScanLineInputFile>_>
           *)in_stack_fffffffffffffdc0);
    CompositeDeepScanLine::addSource(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  }
  else {
    peVar2 = std::
             __shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1a37d3);
    if ((peVar2->_storage == EXR_STORAGE_DEEP_TILED) ||
       (peVar2 = std::
                 __shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1a37ea), peVar2->_storage == EXR_STORAGE_TILED)) {
      std::__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1a380a);
      operator_new(0x20);
      std::__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1a3831);
      TiledInputFile::TiledInputFile
                ((TiledInputFile *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      std::unique_ptr<Imf_3_3::TiledInputFile,_std::default_delete<Imf_3_3::TiledInputFile>_>::reset
                ((unique_ptr<Imf_3_3::TiledInputFile,_std::default_delete<Imf_3_3::TiledInputFile>_>
                  *)in_stack_fffffffffffffdc0,(pointer)in_stack_fffffffffffffdb8);
    }
    else {
      peVar2 = std::
               __shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1a388e);
      if (peVar2->_storage != EXR_STORAGE_SCANLINE) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1b0);
        poVar3 = std::operator<<(local_1a0,"Unable to handle data storage type in file \'");
        pcVar4 = fileName((InputFile *)0x1a395d);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::operator<<(poVar3,"\'");
        text = (stringstream *)__cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc((ArgExc *)poVar3,text);
        __cxa_throw(text,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
      std::__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1a38ae);
      part = (InputPartData *)operator_new(0x20);
      this_00 = part;
      std::__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<Imf_3_3::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1a38d5);
      ScanLineInputFile::ScanLineInputFile((ScanLineInputFile *)this_00,part);
      std::unique_ptr<Imf_3_3::ScanLineInputFile,_std::default_delete<Imf_3_3::ScanLineInputFile>_>
      ::reset((unique_ptr<Imf_3_3::ScanLineInputFile,_std::default_delete<Imf_3_3::ScanLineInputFile>_>
               *)in_stack_fffffffffffffdc0,(pointer)in_stack_fffffffffffffdb8);
    }
  }
  return;
}

Assistant:

void
InputFile::initialize (void)
{
    int partidx;

    partidx = _data->getPartIdx ();
    _data->_storage = _ctxt.storage (partidx);

    // silly protection rules mean make_unique can't be used here
    if (_data->_storage == EXR_STORAGE_DEEP_SCANLINE)
    {
        _data->_dsFile.reset (new DeepScanLineInputFile (_data->_part));
        _data->_compositor = std::make_unique<CompositeDeepScanLine> ();
        _data->_compositor->addSource (_data->_dsFile.get ());
    }
    else if (
        _data->_storage == EXR_STORAGE_DEEP_TILED ||
        _data->_storage == EXR_STORAGE_TILED)
    {
        _data->_tFile.reset (new TiledInputFile (_data->_part));
    }
    else if (_data->_storage == EXR_STORAGE_SCANLINE)
    {
        _data->_sFile.reset (new ScanLineInputFile (_data->_part));
    }
    else
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Unable to handle data storage type in file '" << fileName ()
                                                           << "'");
    }
}